

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBase64(EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
                ArrayPtr<const_char> input)

{
  kj kVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  byte *__src;
  byte *pbVar5;
  byte *pbVar6;
  kj *pkVar7;
  uchar *ptrCopy;
  kj *pkVar8;
  ulong elementCount;
  ulong uVar9;
  ulong elementCount_00;
  bool bVar10;
  bool bVar11;
  
  elementCount_00 = (long)input.ptr * 6 + 7U >> 3;
  uVar9 = 0;
  __src = (byte *)_::HeapArrayDisposer::allocateImpl
                            (1,elementCount_00,elementCount_00,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
  pkVar7 = this + (int)input.ptr;
  bVar11 = false;
  pbVar5 = __src;
LAB_0020859c:
  do {
    pbVar6 = pbVar5;
    if (this == pkVar7) {
LAB_00208713:
      elementCount = (ulong)((int)pbVar6 - (int)__src);
      pbVar5 = __src;
      uVar9 = elementCount_00;
      if (elementCount < elementCount_00) {
        pbVar5 = (byte *)_::HeapArrayDisposer::allocateImpl
                                   (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                    (_func_void_void_ptr *)0x0);
        memcpy(pbVar5,__src,elementCount);
        uVar9 = elementCount;
        if (__src != (byte *)0x0) {
          _::HeapArrayDisposer::disposeImpl
                    ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,__src,1,elementCount_00,
                     elementCount_00,(_func_void_void_ptr *)0x0);
        }
      }
      (__return_storage_ptr__->super_Array<unsigned_char>).ptr = pbVar5;
      (__return_storage_ptr__->super_Array<unsigned_char>).size_ = uVar9;
      (__return_storage_ptr__->super_Array<unsigned_char>).disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      __return_storage_ptr__->hadErrors = bVar11;
      return __return_storage_ptr__;
    }
    kVar1 = *this;
    this = this + 1;
    cVar2 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)kVar1];
    bVar10 = (bool)(cVar2 < -1 | bVar11);
    bVar11 = (bool)(cVar2 < -1 | bVar11);
  } while (cVar2 < '\0');
  *pbVar5 = cVar2 << 2;
  do {
    bVar11 = bVar10;
    if (this == pkVar7) {
      bVar11 = true;
      goto LAB_00208713;
    }
    kVar1 = *this;
    this = this + 1;
    bVar3 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)kVar1];
    bVar10 = (bool)(bVar11 | (char)bVar3 < -1);
  } while ((char)bVar3 < '\0');
  *pbVar5 = cVar2 << 2 | bVar3 >> 4 & 3;
  pbVar5[1] = bVar3 << 4;
  if (this != pkVar7) {
    bVar10 = (bool)(bVar11 | (char)bVar3 < -1);
    do {
      bVar4 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)*this];
      if ((bVar10) || ((char)bVar4 < -2)) {
        bVar10 = true;
        if (-1 < (char)bVar4) goto LAB_00208670;
      }
      else if (*this == (kj)0x3d) {
        uVar9 = uVar9 + 1;
        bVar10 = 2 < uVar9;
        if (-1 < (char)bVar4) goto LAB_00208662;
      }
      else {
        if (-1 < (char)bVar4) goto LAB_0020866a;
        bVar10 = false;
      }
      this = this + 1;
      if (this == pkVar7) break;
    } while( true );
  }
  bVar11 = (bool)(uVar9 == 1 | bVar10);
  pbVar6 = pbVar5 + 1;
  goto LAB_00208713;
LAB_00208662:
  bVar10 = true;
  if (uVar9 < 3) {
LAB_0020866a:
    bVar10 = uVar9 != 0;
  }
LAB_00208670:
  pbVar6 = pbVar5 + 2;
  pbVar5[1] = bVar3 << 4 | bVar4 >> 2 & 0xf;
  pbVar5[2] = bVar4 << 6;
  do {
    while( true ) {
      while( true ) {
        bVar11 = bVar10;
        pkVar8 = this;
        this = pkVar8 + 1;
        if (this == pkVar7) goto LAB_00208713;
        bVar3 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)*this];
        if ((!bVar11) && (-3 < (char)bVar3)) break;
        bVar11 = true;
        bVar10 = true;
        if (-1 < (char)bVar3) goto LAB_002086e1;
      }
      if (*this == (kj)0x3d) break;
      if (-1 < (char)bVar3) goto LAB_002086db;
      bVar10 = false;
    }
    uVar9 = uVar9 + 1;
    bVar10 = 1 < uVar9;
  } while ((char)bVar3 < '\0');
  bVar11 = true;
  if (uVar9 < 2) {
LAB_002086db:
    bVar11 = uVar9 != 0;
  }
LAB_002086e1:
  pbVar5[2] = bVar4 << 6 | bVar3 & 0x3f;
  pbVar5 = pbVar5 + 3;
  this = pkVar8 + 2;
  goto LAB_0020859c;
}

Assistant:

EncodingResult<Array<byte>> decodeBase64(ArrayPtr<const char> input) {
  base64_decodestate state;

  auto output = heapArray<byte>((input.size() * 6 + 7) / 8);

  size_t n = base64_decode_block(input.begin(), input.size(),
      reinterpret_cast<char*>(output.begin()), &state);

  if (n < output.size()) {
    auto copy = heapArray<byte>(n);
    memcpy(copy.begin(), output.begin(), n);
    output = kj::mv(copy);
  }

  return EncodingResult<Array<byte>>(kj::mv(output), state.hadErrors);
}